

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall ON_HistoryRecord::Internal_ReadV5(ON_HistoryRecord *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int count;
  ON_Value *value;
  int value_id;
  int value_type;
  int mjv;
  int minor_version;
  int mnv;
  int mjvs;
  int major_version;
  int mnvs;
  ON_UUID record_id;
  uint local_84;
  ON_Value *local_80;
  int local_78;
  ON__INT32 local_74;
  ON__INT32 local_70;
  int local_6c;
  int local_68 [4];
  ON_SimpleArray<ON_Value_*> *local_58;
  int local_4c;
  ON_UUID local_48;
  
  operator=(this,&Empty);
  local_68[3] = 0;
  local_68[0] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_68 + 3,local_68);
  if (!bVar1) {
    return false;
  }
  if (local_68[3] == 1) {
    local_48.Data1 = 0;
    local_48.Data2 = 0;
    local_48.Data3 = 0;
    local_48.Data4[0] = '\0';
    local_48.Data4[1] = '\0';
    local_48.Data4[2] = '\0';
    local_48.Data4[3] = '\0';
    local_48.Data4[4] = '\0';
    local_48.Data4[5] = '\0';
    local_48.Data4[6] = '\0';
    local_48.Data4[7] = '\0';
    bVar1 = ON_BinaryArchive::ReadUuid(archive,&local_48);
    if (bVar1) {
      ON_ModelComponent::SetId(&this->super_ON_ModelComponent,&local_48);
      bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_version);
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_command_id), bVar1)) {
        bVar1 = false;
        bVar2 = ON_UuidList::Read(&this->m_descendants,archive,false);
        if (bVar2) {
          bVar2 = ON_UuidList::Read(&this->m_antecedents,archive);
          bVar1 = false;
          if (bVar2) {
            local_68[2] = 0;
            local_4c = 0;
            bVar2 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_68 + 2,&local_4c);
            if (bVar2) {
              local_84 = 0;
              bVar2 = false;
              if (local_68[2] == 1) {
                bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__INT32 *)&local_84);
                if (bVar1) {
                  if ((uint)(this->m_value).m_capacity < local_84) {
                    ON_SimpleArray<ON_Value_*>::SetCapacity(&this->m_value,(long)(int)local_84);
                  }
                  if ((int)local_84 < 1) {
                    bVar2 = true;
                  }
                  else {
                    local_58 = &this->m_value;
                    iVar5 = 1;
                    local_78 = 0;
                    do {
                      local_6c = 0;
                      local_68[1] = 0;
                      bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                                        (archive,0x40008000,&local_6c,local_68 + 1);
                      if (!bVar1) goto LAB_005594ce;
                      if (local_6c == 1) {
                        local_70 = 0;
                        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_70);
                        if (!bVar1) goto LAB_00559478;
                        local_74 = 0;
                        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_74);
                        if (!bVar1) goto LAB_00559478;
                        local_80 = ON_Value::CreateValue(local_70);
                        bVar2 = true;
                        iVar4 = local_78;
                        if (local_80 != (ON_Value *)0x0) {
                          local_80->m_value_id = local_74;
                          iVar4 = (*local_80->_vptr_ON_Value[4])(local_80,archive);
                          if ((char)iVar4 == '\0') {
                            if (local_80 != (ON_Value *)0x0) {
                              (*local_80->_vptr_ON_Value[1])();
                            }
                            goto LAB_00559478;
                          }
                          ON_SimpleArray<ON_Value_*>::Append(local_58,&local_80);
                          iVar4 = local_80->m_value_id;
                          if (local_80->m_value_id <= local_78) {
                            this->m_bValuesSorted = false;
                            iVar4 = local_78;
                          }
                        }
                      }
                      else {
LAB_00559478:
                        bVar2 = false;
                        iVar4 = local_78;
                      }
                      local_78 = iVar4;
                      bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
                      if (!bVar1) {
                        bVar2 = false;
                      }
                    } while ((iVar5 < (int)local_84) && (iVar5 = iVar5 + 1, bVar2 != false));
                  }
                }
                else {
LAB_005594ce:
                  bVar2 = false;
                }
              }
              bVar3 = ON_BinaryArchive::EndRead3dmChunk(archive);
              bVar1 = false;
              if (bVar3) {
                bVar1 = bVar2;
              }
              if ((bVar1 == true) && (0 < local_68[0])) {
                local_80 = (ON_Value *)((ulong)local_80 & 0xffffffff00000000);
                bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__INT32 *)&local_80);
                if (bVar1) {
                  this->m_record_type = (uint)((int)local_80 == 1);
                  if (1 < local_68[0]) {
                    ON_BinaryArchive::ReadBool(archive,&this->m_bCopyOnReplaceObject);
                  }
                }
              }
            }
          }
        }
        goto LAB_005594ae;
      }
    }
  }
  bVar1 = false;
LAB_005594ae:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_HistoryRecord::Internal_ReadV5( ON_BinaryArchive& archive )
{
  *this = ON_HistoryRecord::Empty;

  // put entire history record in a chunk
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    ON_UUID record_id = ON_nil_uuid;
    rc = archive.ReadUuid(record_id);
    if(!rc) break;
    SetId(record_id);

    rc = archive.ReadInt(&m_version);
    if(!rc) break;

    rc = archive.ReadUuid(m_command_id);
    if(!rc) break;

    // 16 October 2012 Dale Lear
    //   Fixing http://dev.mcneel.com/bugtrack/?q=101403
    // Changing bSortDescendantsAfterRead from true to false
    // per discussion in the bug report. 
    const bool bSortDescendantsAferRead = false;
    rc = m_descendants.Read(archive,bSortDescendantsAferRead);
    if(!rc) break;

    rc = m_antecedents.Read(archive);
    if(!rc) break;

    // all values are in a chunk
    int mjvs=0,mnvs=0;
    int value_id0 = 0;
    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjvs,&mnvs);
    if (rc)
    {
      rc = ( 1 == mjvs );

      int i, count = 0;
      if (rc) 
        rc = archive.ReadInt(&count);

      if (rc)
        m_value.Reserve(count);

      for ( i = 0; i < count && rc; i++ )
      {
        int mjv=0,mnv=0;
        rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
        if ( !rc)
          break;
        for(;;)
        {
          rc = ( 1 == mjv);
          if (!rc) break;
          int value_type = ON_Value::no_value_type;
          rc = archive.ReadInt(&value_type);
          if (!rc) 
            break;

          int value_id = 0;
          rc = archive.ReadInt(&value_id);
          if (!rc) 
            break;

          ON_Value* value = ON_Value::CreateValue(value_type);
          if ( value )
          {        
            value->m_value_id = value_id;
            rc = value->ReadHelper(archive);
            if (!rc) 
            {
              delete value;
              break;
            }
            m_value.Append(value);
            if ( value->m_value_id <= value_id0 )
              m_bValuesSorted = false;
            else
              value_id0 = value->m_value_id;
          }

          break;
        }
        if (!archive.EndRead3dmChunk())
          rc = false;
      }

      // end of all values
      if (!archive.EndRead3dmChunk())
        rc = false;
    }

    if ( rc && minor_version >= 1 )
    {
      // 1.1 fields added to opennurbs version 200603200
      int rec_type = (int)ON_HistoryRecord::RECORD_TYPE::history_parameters;
      if (rc)
        rc = archive.ReadInt( &rec_type );
      if (rc )
        m_record_type = RecordType(rec_type);

      if (rc && minor_version >= 2)
      {
        archive.ReadBool(&m_bCopyOnReplaceObject);
      }

    }

    break;
  }

  // end of entire history record in a chunk
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}